

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * decDecap(decNumber *dn,int32_t drop)

{
  int iVar1;
  int32_t iVar2;
  uint8_t *puVar3;
  uint local_44;
  uint local_3c;
  int32_t cut;
  uint8_t *msu;
  int32_t drop_local;
  decNumber *dn_local;
  
  if (drop < dn->digits) {
    if (dn->digits - drop < 0x32) {
      local_3c = (uint)""[dn->digits - drop];
    }
    else {
      local_3c = (dn->digits - drop) / 1;
    }
    puVar3 = dn->lsu + (long)(int)local_3c + -1;
    if (dn->digits - drop < 0x32) {
      local_44 = (uint)""[dn->digits - drop];
    }
    else {
      local_44 = (dn->digits - drop) / 1;
    }
    iVar1 = (dn->digits - drop) - (local_44 - 1);
    if (iVar1 != 1) {
      *puVar3 = (byte)((uint)*puVar3 % DECPOWERS[iVar1]);
    }
    iVar2 = decGetDigits(dn->lsu,((int)puVar3 - ((int)dn + 9)) + 1);
    dn->digits = iVar2;
  }
  else {
    dn->lsu[0] = '\0';
    dn->digits = 1;
  }
  return dn;
}

Assistant:

static decNumber *decDecap(decNumber *dn, Int drop) {
  Unit *msu;                            /* -> target cut point  */
  Int cut;                              /* work  */
  if (drop>=dn->digits) {               /* losing the whole thing  */
    #if DECCHECK
    if (drop>dn->digits)
      printf("decDecap called with drop>digits [%ld>%ld]\n",
             (LI)drop, (LI)dn->digits);
    #endif
    dn->lsu[0]=0;
    dn->digits=1;
    return dn;
    }
  msu=dn->lsu+D2U(dn->digits-drop)-1;   /* -> likely msu  */
  cut=MSUDIGITS(dn->digits-drop);       /* digits to be in use in msu  */
  if (cut!=DECDPUN) *msu%=powers[cut];  /* clear left digits  */
  /* that may have left leading zero digits, so do a proper count...  */
  dn->digits=decGetDigits(dn->lsu, static_cast<int32_t>(msu-dn->lsu+1));
  return dn;
  }